

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O1

int run_test_tcp_bind_error_fault(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  long *plVar3;
  int64_t eval_b;
  int64_t eval_a;
  char garbage [60];
  uv_tcp_t server;
  long alStack_890 [4];
  undefined1 auStack_870 [216];
  code *pcStack_798;
  long lStack_788;
  long lStack_780;
  long alStack_778 [11];
  undefined1 auStack_720 [16];
  long alStack_710 [25];
  undefined1 auStack_648 [16];
  long alStack_638 [27];
  code *pcStack_560;
  long lStack_550;
  long lStack_548;
  undefined1 auStack_540 [216];
  code *pcStack_468;
  long lStack_458;
  long lStack_450;
  undefined1 auStack_448 [16];
  long alStack_438 [27];
  code *pcStack_360;
  long lStack_350;
  long lStack_348;
  undefined1 auStack_340 [16];
  long alStack_330 [27];
  code *pcStack_258;
  long lStack_248;
  long lStack_240;
  undefined8 auStack_238 [2];
  undefined1 auStack_228 [16];
  long alStack_218 [27];
  code *pcStack_140;
  long local_138;
  long local_130;
  char local_128 [72];
  undefined1 local_e0 [216];
  
  builtin_strncpy(local_128 + 0x30,"h blah blah",0xc);
  builtin_strncpy(local_128 + 0x20,"ah blah blah bla",0x10);
  builtin_strncpy(local_128 + 0x10,"lah blah blah bl",0x10);
  builtin_strncpy(local_128,"blah blah blah b",0x10);
  pcStack_140 = (code *)0x1c65dd;
  uVar2 = uv_default_loop();
  pcStack_140 = (code *)0x1c65ea;
  iVar1 = uv_tcp_init(uVar2,local_e0);
  local_130 = (long)iVar1;
  local_138 = 0;
  if (local_130 == 0) {
    pcStack_140 = (code *)0x1c6619;
    iVar1 = uv_tcp_bind(local_e0,local_128,0);
    local_130 = (long)iVar1;
    local_138 = -0x16;
    if (local_130 != -0x16) goto LAB_001c66dd;
    pcStack_140 = (code *)0x1c6648;
    uv_close(local_e0,close_cb);
    pcStack_140 = (code *)0x1c664d;
    uVar2 = uv_default_loop();
    pcStack_140 = (code *)0x1c6657;
    uv_run(uVar2,0);
    local_130 = 1;
    local_138 = (long)close_cb_called;
    if (local_138 != 1) goto LAB_001c66ea;
    pcStack_140 = (code *)0x1c667b;
    unaff_RBX = uv_default_loop();
    pcStack_140 = (code *)0x1c668f;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_140 = (code *)0x1c6699;
    uv_run(unaff_RBX,0);
    local_130 = 0;
    pcStack_140 = (code *)0x1c66a7;
    uVar2 = uv_default_loop();
    pcStack_140 = (code *)0x1c66af;
    iVar1 = uv_loop_close(uVar2);
    local_138 = (long)iVar1;
    if (local_130 == local_138) {
      pcStack_140 = (code *)0x1c66c5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_140 = (code *)0x1c66dd;
    run_test_tcp_bind_error_fault_cold_1();
LAB_001c66dd:
    pcStack_140 = (code *)0x1c66ea;
    run_test_tcp_bind_error_fault_cold_2();
LAB_001c66ea:
    pcStack_140 = (code *)0x1c66f7;
    run_test_tcp_bind_error_fault_cold_3();
  }
  pcStack_140 = run_test_tcp_bind_error_inval;
  run_test_tcp_bind_error_fault_cold_4();
  pcStack_258 = (code *)0x1c6722;
  pcStack_140 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_228);
  alStack_218[0] = (long)iVar1;
  auStack_238[0] = 0;
  if (alStack_218[0] == 0) {
    pcStack_258 = (code *)0x1c6758;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,auStack_238);
    alStack_218[0] = (long)iVar1;
    lStack_248 = 0;
    if (alStack_218[0] != 0) goto LAB_001c68bc;
    pcStack_258 = (code *)0x1c677d;
    uVar2 = uv_default_loop();
    pcStack_258 = (code *)0x1c678a;
    iVar1 = uv_tcp_init(uVar2,alStack_218);
    lStack_248 = (long)iVar1;
    lStack_240 = 0;
    if (lStack_248 != 0) goto LAB_001c68cb;
    pcStack_258 = (code *)0x1c67bb;
    iVar1 = uv_tcp_bind(alStack_218,auStack_228,0);
    lStack_248 = (long)iVar1;
    lStack_240 = 0;
    if (lStack_248 != 0) goto LAB_001c68da;
    pcStack_258 = (code *)0x1c67ec;
    iVar1 = uv_tcp_bind(alStack_218,auStack_238,0);
    lStack_248 = (long)iVar1;
    lStack_240 = -0x16;
    if (lStack_248 != -0x16) goto LAB_001c68e9;
    pcStack_258 = (code *)0x1c681d;
    uv_close(alStack_218,close_cb);
    pcStack_258 = (code *)0x1c6822;
    uVar2 = uv_default_loop();
    pcStack_258 = (code *)0x1c682c;
    uv_run(uVar2,0);
    lStack_248 = 1;
    lStack_240 = (long)close_cb_called;
    if (lStack_240 != 1) goto LAB_001c68f8;
    pcStack_258 = (code *)0x1c6856;
    unaff_RBX = uv_default_loop();
    pcStack_258 = (code *)0x1c686a;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_258 = (code *)0x1c6874;
    uv_run(unaff_RBX,0);
    lStack_248 = 0;
    pcStack_258 = (code *)0x1c6882;
    uVar2 = uv_default_loop();
    pcStack_258 = (code *)0x1c688a;
    iVar1 = uv_loop_close(uVar2);
    lStack_240 = (long)iVar1;
    if (lStack_248 == lStack_240) {
      pcStack_258 = (code *)0x1c68a2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_258 = (code *)0x1c68bc;
    run_test_tcp_bind_error_inval_cold_1();
LAB_001c68bc:
    pcStack_258 = (code *)0x1c68cb;
    run_test_tcp_bind_error_inval_cold_2();
LAB_001c68cb:
    pcStack_258 = (code *)0x1c68da;
    run_test_tcp_bind_error_inval_cold_3();
LAB_001c68da:
    pcStack_258 = (code *)0x1c68e9;
    run_test_tcp_bind_error_inval_cold_4();
LAB_001c68e9:
    pcStack_258 = (code *)0x1c68f8;
    run_test_tcp_bind_error_inval_cold_5();
LAB_001c68f8:
    pcStack_258 = (code *)0x1c6907;
    run_test_tcp_bind_error_inval_cold_6();
  }
  pcStack_258 = run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  pcStack_360 = (code *)0x1c6934;
  pcStack_258 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_340);
  alStack_330[0] = (long)iVar1;
  lStack_350 = 0;
  if (alStack_330[0] == 0) {
    pcStack_360 = (code *)0x1c6959;
    uVar2 = uv_default_loop();
    pcStack_360 = (code *)0x1c6966;
    iVar1 = uv_tcp_init(uVar2,alStack_330);
    lStack_350 = (long)iVar1;
    lStack_348 = 0;
    if (lStack_350 != 0) goto LAB_001c6a1e;
    pcStack_360 = (code *)0x1c6997;
    iVar1 = uv_tcp_bind(alStack_330,auStack_340,0);
    lStack_350 = (long)iVar1;
    lStack_348 = 0;
    if (lStack_350 != 0) goto LAB_001c6a2d;
    pcStack_360 = (code *)0x1c69b8;
    unaff_RBX = uv_default_loop();
    pcStack_360 = (code *)0x1c69cc;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_360 = (code *)0x1c69d6;
    uv_run(unaff_RBX,0);
    lStack_350 = 0;
    pcStack_360 = (code *)0x1c69e4;
    uVar2 = uv_default_loop();
    pcStack_360 = (code *)0x1c69ec;
    iVar1 = uv_loop_close(uVar2);
    lStack_348 = (long)iVar1;
    if (lStack_350 == lStack_348) {
      pcStack_360 = (code *)0x1c6a04;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_360 = (code *)0x1c6a1e;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_001c6a1e:
    pcStack_360 = (code *)0x1c6a2d;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_001c6a2d:
    pcStack_360 = (code *)0x1c6a3c;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  pcStack_360 = run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  pcStack_468 = (code *)0x1c6a69;
  pcStack_360 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_448);
  alStack_438[0] = (long)iVar1;
  lStack_458 = 0;
  if (alStack_438[0] == 0) {
    pcStack_468 = (code *)0x1c6a8e;
    uVar2 = uv_default_loop();
    pcStack_468 = (code *)0x1c6a9b;
    iVar1 = uv_tcp_init(uVar2,alStack_438);
    lStack_458 = (long)iVar1;
    lStack_450 = 0;
    if (lStack_458 != 0) goto LAB_001c6b56;
    pcStack_468 = (code *)0x1c6acf;
    iVar1 = uv_tcp_bind(alStack_438,auStack_448,1);
    lStack_458 = (long)iVar1;
    lStack_450 = -0x16;
    if (lStack_458 != -0x16) goto LAB_001c6b65;
    pcStack_468 = (code *)0x1c6af0;
    unaff_RBX = uv_default_loop();
    pcStack_468 = (code *)0x1c6b04;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_468 = (code *)0x1c6b0e;
    uv_run(unaff_RBX,0);
    lStack_458 = 0;
    pcStack_468 = (code *)0x1c6b1c;
    uVar2 = uv_default_loop();
    pcStack_468 = (code *)0x1c6b24;
    iVar1 = uv_loop_close(uVar2);
    lStack_450 = (long)iVar1;
    if (lStack_458 == lStack_450) {
      pcStack_468 = (code *)0x1c6b3c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_468 = (code *)0x1c6b56;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_001c6b56:
    pcStack_468 = (code *)0x1c6b65;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_001c6b65:
    pcStack_468 = (code *)0x1c6b74;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  pcStack_468 = run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  pcStack_560 = (code *)0x1c6b90;
  pcStack_468 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_560 = (code *)0x1c6b9d;
  iVar1 = uv_tcp_init(uVar2,auStack_540);
  lStack_548 = (long)iVar1;
  lStack_550 = 0;
  if (lStack_548 == 0) {
    pcStack_560 = (code *)0x1c6bce;
    iVar1 = uv_listen(auStack_540,0x80,0);
    lStack_548 = (long)iVar1;
    lStack_550 = 0;
    if (lStack_548 != 0) goto LAB_001c6c55;
    pcStack_560 = (code *)0x1c6bef;
    unaff_RBX = uv_default_loop();
    pcStack_560 = (code *)0x1c6c03;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_560 = (code *)0x1c6c0d;
    uv_run(unaff_RBX,0);
    lStack_548 = 0;
    pcStack_560 = (code *)0x1c6c1b;
    uVar2 = uv_default_loop();
    pcStack_560 = (code *)0x1c6c23;
    iVar1 = uv_loop_close(uVar2);
    lStack_550 = (long)iVar1;
    if (lStack_548 == lStack_550) {
      pcStack_560 = (code *)0x1c6c3b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_560 = (code *)0x1c6c55;
    run_test_tcp_listen_without_bind_cold_1();
LAB_001c6c55:
    pcStack_560 = (code *)0x1c6c64;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pcStack_560 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  pcStack_798 = (code *)0x1c6c91;
  pcStack_560 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_720);
  alStack_638[0] = (long)iVar1;
  alStack_710[0] = 0;
  if (alStack_638[0] == 0) {
    pcStack_798 = (code *)0x1c6cc2;
    uVar2 = uv_default_loop();
    pcStack_798 = (code *)0x1c6cd2;
    iVar1 = uv_tcp_init(uVar2,alStack_638);
    alStack_710[0] = (long)iVar1;
    alStack_778[0] = 0;
    if (alStack_710[0] != 0) goto LAB_001c6f5a;
    pcStack_798 = (code *)0x1c6d0c;
    iVar1 = uv_tcp_bind(alStack_638,auStack_720,0);
    alStack_710[0] = (long)iVar1;
    alStack_778[0] = 0;
    if (alStack_710[0] != 0) goto LAB_001c6f6c;
    pcStack_798 = (code *)0x1c6d46;
    iVar1 = uv_listen(alStack_638,0x80,0);
    alStack_710[0] = (long)iVar1;
    alStack_778[0] = 0;
    if (alStack_710[0] != 0) goto LAB_001c6f7e;
    pcStack_798 = (code *)0x1c6d79;
    iVar1 = uv_is_writable(alStack_638);
    alStack_710[0] = (long)iVar1;
    alStack_778[0] = 0;
    if (alStack_710[0] != 0) goto LAB_001c6f90;
    pcStack_798 = (code *)0x1c6dac;
    iVar1 = uv_is_readable(alStack_638);
    alStack_710[0] = (long)iVar1;
    alStack_778[0] = 0;
    if (alStack_710[0] != 0) goto LAB_001c6fa2;
    pcStack_798 = (code *)0x1c6de3;
    auStack_648 = uv_buf_init("PING",4);
    pcStack_798 = (code *)0x1c6e12;
    iVar1 = uv_write(alStack_710,alStack_638,auStack_648,1,0);
    alStack_778[0] = (long)iVar1;
    lStack_788 = -0x20;
    if (alStack_778[0] != -0x20) goto LAB_001c6fb4;
    pcStack_798 = (code *)0x1c6e46;
    iVar1 = uv_shutdown(alStack_778,alStack_638,0);
    lStack_788 = (long)iVar1;
    lStack_780 = -0x6b;
    if (lStack_788 != -0x6b) goto LAB_001c6fc3;
    pcStack_798 = (code *)0x1c6e7d;
    iVar1 = uv_read_start(alStack_638,abort);
    lStack_788 = (long)iVar1;
    lStack_780 = -0x6b;
    if (lStack_788 != -0x6b) goto LAB_001c6fd2;
    pcStack_798 = (code *)0x1c6eb1;
    uv_close(alStack_638,close_cb);
    pcStack_798 = (code *)0x1c6eb6;
    uVar2 = uv_default_loop();
    pcStack_798 = (code *)0x1c6ec0;
    uv_run(uVar2,0);
    lStack_788 = 1;
    lStack_780 = (long)close_cb_called;
    if (lStack_780 != 1) goto LAB_001c6fe1;
    pcStack_798 = (code *)0x1c6eea;
    unaff_RBX = uv_default_loop();
    pcStack_798 = (code *)0x1c6efe;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_798 = (code *)0x1c6f08;
    uv_run(unaff_RBX,0);
    lStack_788 = 0;
    pcStack_798 = (code *)0x1c6f16;
    uVar2 = uv_default_loop();
    pcStack_798 = (code *)0x1c6f1e;
    iVar1 = uv_loop_close(uVar2);
    lStack_780 = (long)iVar1;
    if (lStack_788 == lStack_780) {
      pcStack_798 = (code *)0x1c6f3a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_798 = (code *)0x1c6f5a;
    run_test_tcp_bind_writable_flags_cold_1();
LAB_001c6f5a:
    pcStack_798 = (code *)0x1c6f6c;
    run_test_tcp_bind_writable_flags_cold_2();
LAB_001c6f6c:
    pcStack_798 = (code *)0x1c6f7e;
    run_test_tcp_bind_writable_flags_cold_3();
LAB_001c6f7e:
    pcStack_798 = (code *)0x1c6f90;
    run_test_tcp_bind_writable_flags_cold_4();
LAB_001c6f90:
    pcStack_798 = (code *)0x1c6fa2;
    run_test_tcp_bind_writable_flags_cold_5();
LAB_001c6fa2:
    pcStack_798 = (code *)0x1c6fb4;
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001c6fb4:
    pcStack_798 = (code *)0x1c6fc3;
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001c6fc3:
    pcStack_798 = (code *)0x1c6fd2;
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001c6fd2:
    pcStack_798 = (code *)0x1c6fe1;
    run_test_tcp_bind_writable_flags_cold_9();
LAB_001c6fe1:
    pcStack_798 = (code *)0x1c6ff0;
    run_test_tcp_bind_writable_flags_cold_10();
  }
  pcStack_798 = run_test_tcp_bind_or_listen_error_after_close;
  run_test_tcp_bind_writable_flags_cold_11();
  alStack_890[2] = 0;
  alStack_890[1] = 0xf270002;
  pcStack_798 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,auStack_870);
  alStack_890[0] = (long)iVar1;
  if (alStack_890[0] == 0) {
    uv_close(auStack_870,0);
    iVar1 = uv_tcp_bind(auStack_870,alStack_890 + 1,0);
    alStack_890[0] = (long)iVar1;
    if (alStack_890[0] != -0x16) goto LAB_001c7146;
    iVar1 = uv_listen(auStack_870,5,0);
    alStack_890[0] = (long)iVar1;
    if (alStack_890[0] != -0x16) goto LAB_001c7153;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    alStack_890[0] = (long)iVar1;
    if (alStack_890[0] == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      alStack_890[0] = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (alStack_890[0] == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c716d;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c7146:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c7153:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c716d:
  plVar3 = alStack_890;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind_error_fault) {
  char garbage[] =
      "blah blah blah blah blah blah blah blah blah blah blah blah";
  struct sockaddr_in* garbage_addr;
  uv_tcp_t server;
  int r;

  garbage_addr = (struct sockaddr_in*) &garbage;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) garbage_addr, 0);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}